

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

Statement *
slang::ast::ReturnStatement::fromSyntax
          (Compilation *compilation,ReturnStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Scope *pSVar1;
  Symbol *pSVar2;
  bool bVar3;
  ASTContext *pAVar4;
  DeclaredType *this;
  Type *this_00;
  Type *pTVar5;
  ReturnStatement *stmt;
  Statement *pSVar6;
  DiagCode code;
  SourceRange SVar7;
  SourceRange assignmentRange;
  Expression *retExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  Expression *local_48;
  SourceRange local_40;
  
  pAVar4 = context;
  if (((stmtCtx->flags).m_bits & 2) == 0) {
    do {
      pSVar1 = (pAVar4->scope).ptr;
      pSVar2 = pSVar1->thisSym;
      pAVar4 = (ASTContext *)&pSVar2->parentScope;
    } while (pSVar2->kind == StatementBlock);
    SVar7 = parsing::Token::range(&syntax->returnKeyword);
    pSVar2 = pSVar1->thisSym;
    if ((pSVar2->kind == Subroutine) || (pSVar2->kind == RandSeqProduction)) {
      this = Symbol::getDeclaredType(pSVar2);
      this_00 = DeclaredType::getType(this);
      local_48 = (Expression *)0x0;
      if ((Type *)syntax->returnValue != (Type *)0x0) {
        assignmentRange.endLoc = (SourceLocation)context;
        assignmentRange.startLoc = SVar7.endLoc;
        local_48 = Expression::bindRValue
                             ((Expression *)this_00,(Type *)syntax->returnValue,
                              (ExpressionSyntax *)SVar7.startLoc,assignmentRange,(ASTContext *)0x0,
                              in_stack_ffffffffffffffa8);
LAB_00446562:
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        stmt = BumpAllocator::
               emplace<slang::ast::ReturnStatement,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,&local_48,&local_40);
        if ((local_48 != (Expression *)0x0) && (bVar3 = Expression::bad(local_48), bVar3)) {
          stmt = (ReturnStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
        }
        return &stmt->super_Statement;
      }
      pTVar5 = this_00->canonical;
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar5 = this_00->canonical;
      }
      if ((pTVar5->super_Symbol).kind == VoidType) goto LAB_00446562;
      code = (DiagCode)((uint)(pSVar2->kind != Subroutine) * 0x10000 + 0x6f0007);
      SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    }
    else {
      code.subsystem = Statements;
      code.code = 0x42;
    }
    ASTContext::addDiag(context,code,SVar7);
  }
  else {
    SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x410008,SVar7);
  }
  pSVar6 = Statement::badStmt(compilation,(Statement *)0x0);
  return pSVar6;
}

Assistant:

Statement& ReturnStatement::fromSyntax(Compilation& compilation,
                                       const ReturnStatementSyntax& syntax,
                                       const ASTContext& context, StatementContext& stmtCtx) {
    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::ReturnInParallel, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    // Find the parent subroutine or randsequence production.
    const Scope* scope = context.scope;
    while (scope->asSymbol().kind == SymbolKind::StatementBlock)
        scope = scope->asSymbol().getParentScope();

    auto stmtRange = syntax.returnKeyword.range();
    auto& symbol = scope->asSymbol();
    if (symbol.kind != SymbolKind::Subroutine && symbol.kind != SymbolKind::RandSeqProduction) {
        context.addDiag(diag::ReturnNotInSubroutine, stmtRange);
        return badStmt(compilation, nullptr);
    }

    auto& returnType = symbol.getDeclaredType()->getType();
    const Expression* retExpr = nullptr;
    if (syntax.returnValue) {
        retExpr = &Expression::bindRValue(returnType, *syntax.returnValue, stmtRange, context);
    }
    else if (!returnType.isVoid()) {
        DiagCode code = symbol.kind == SymbolKind::Subroutine ? diag::MissingReturnValue
                                                              : diag::MissingReturnValueProd;
        context.addDiag(code, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    auto result = compilation.emplace<ReturnStatement>(retExpr, syntax.sourceRange());
    if (retExpr && retExpr->bad())
        return badStmt(compilation, result);

    return *result;
}